

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<84>::ShiftLeft(BigUnsigned<84> *this,int count)

{
  int *piVar1;
  byte bVar2;
  uint local_2c [3];
  int local_20;
  int i;
  int local_18;
  int local_14;
  int word_shift;
  int count_local;
  BigUnsigned<84> *this_local;
  
  if (0 < count) {
    local_18 = count / 0x20;
    local_14 = count;
    _word_shift = this;
    if (local_18 < 0x54) {
      i = this->size_ + local_18;
      local_20 = 0x54;
      piVar1 = std::min<int>(&i,&local_20);
      this->size_ = *piVar1;
      local_14 = local_14 % 0x20;
      if (local_14 == 0) {
        std::copy_backward<unsigned_int*,unsigned_int*>
                  (this->words_,
                   (uint *)((long)this + (long)local_18 * -4 + (long)this->size_ * 4 + 4),
                   this->words_ + this->size_);
      }
      else {
        local_2c[1] = 0x53;
        piVar1 = std::min<int>(&this->size_,(int *)(local_2c + 1));
        for (local_2c[2] = *piVar1; bVar2 = (byte)local_14, local_18 < (int)local_2c[2];
            local_2c[2] = local_2c[2] + -1) {
          this->words_[(int)local_2c[2]] =
               this->words_[(int)(local_2c[2] - local_18)] << (bVar2 & 0x1f) |
               this->words_[(int)((local_2c[2] - local_18) + -1)] >> (0x20 - bVar2 & 0x1f);
        }
        this->words_[local_18] = this->words_[0] << (bVar2 & 0x1f);
        if ((this->size_ < 0x54) && (this->words_[this->size_] != 0)) {
          this->size_ = this->size_ + 1;
        }
      }
      local_2c[0] = 0;
      std::fill_n<unsigned_int*,int,unsigned_int>(this->words_,local_18,local_2c);
    }
    else {
      SetToZero(this);
    }
  }
  return;
}

Assistant:

void ShiftLeft(int count) {
    if (count > 0) {
      const int word_shift = count / 32;
      if (word_shift >= max_words) {
        SetToZero();
        return;
      }
      size_ = (std::min)(size_ + word_shift, max_words);
      count %= 32;
      if (count == 0) {
// https://gcc.gnu.org/bugzilla/show_bug.cgi?id=warray-bounds
// shows a lot of bogus -Warray-bounds warnings under GCC.
// This is not the only one in Abseil.
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
        std::copy_backward(words_, words_ + size_ - word_shift, words_ + size_);
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic pop
#endif
      } else {
        for (int i = (std::min)(size_, max_words - 1); i > word_shift; --i) {
          words_[i] = (words_[i - word_shift] << count) |
                      (words_[i - word_shift - 1] >> (32 - count));
        }
        words_[word_shift] = words_[0] << count;
        // Grow size_ if necessary.
        if (size_ < max_words && words_[size_]) {
          ++size_;
        }
      }
      std::fill_n(words_, word_shift, 0u);
    }
  }